

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parquet.cpp
# Opt level: O1

void __thiscall duckdb::FieldID::Serialize(FieldID *this,Serializer *serializer)

{
  Serializer::WritePropertyWithDefault<bool>(serializer,100,"set",&this->set);
  Serializer::WritePropertyWithDefault<int>(serializer,0x65,"field_id",&this->field_id);
  (*serializer->_vptr_Serializer[2])(serializer,0x66,"child_field_ids");
  Serializer::WriteValue<duckdb::ChildFieldIDs>(serializer,&this->child_field_ids);
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

void FieldID::Serialize(Serializer &serializer) const {
	serializer.WritePropertyWithDefault<bool>(100, "set", set);
	serializer.WritePropertyWithDefault<int32_t>(101, "field_id", field_id);
	serializer.WriteProperty<ChildFieldIDs>(102, "child_field_ids", child_field_ids);
}